

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskflow.hpp
# Opt level: O0

void __thiscall tf::Taskflow::Taskflow(Taskflow *this)

{
  FlowBuilder *in_RDI;
  string *this_00;
  
  FlowBuilder::FlowBuilder(in_RDI,(Graph *)(in_RDI + 10));
  std::mutex::mutex((mutex *)0x154272);
  this_00 = (string *)(in_RDI + 6);
  std::__cxx11::string::string(this_00);
  Graph::Graph((Graph *)0x15428f);
  std::
  queue<std::shared_ptr<tf::Topology>,std::deque<std::shared_ptr<tf::Topology>,std::allocator<std::shared_ptr<tf::Topology>>>>
  ::
  queue<std::deque<std::shared_ptr<tf::Topology>,std::allocator<std::shared_ptr<tf::Topology>>>,void>
            ((queue<std::shared_ptr<tf::Topology>,_std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>_>
              *)this_00);
  std::optional<std::_List_iterator<tf::Taskflow>_>::optional
            ((optional<std::_List_iterator<tf::Taskflow>_> *)0x1542b0);
  return;
}

Assistant:

inline Taskflow::Taskflow() : FlowBuilder{_graph} {
}